

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_obj.c
# Opt level: O2

mesh * import_obj_model(scene *scene,char *file_name)

{
  obj_index *key;
  obj_index *poVar1;
  attr_buf *paVar2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  vec3 *pvVar6;
  long lVar7;
  ulong uVar8;
  size_t *psVar9;
  uint __line;
  uint32_t hash;
  obj_model *model;
  size_t sVar10;
  hash_table *hash_table;
  mesh *mesh;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  char *__assertion;
  size_t sVar19;
  long lVar20;
  void *pvVar21;
  byte bVar22;
  obj_face *poVar23;
  bool bVar24;
  bool bVar25;
  size_t local_38;
  
  model = load_obj_model(file_name);
  if (model == (obj_model *)0x0) {
    mesh = (mesh *)0x0;
  }
  else {
    sVar10 = model->face_count;
    lVar14 = 8;
    sVar19 = 0;
    while (bVar24 = sVar10 != 0, sVar10 = sVar10 - 1, bVar24) {
      uVar16 = *(ulong *)((long)&model->faces->first_index + lVar14);
      lVar18 = uVar16 - 2;
      if (uVar16 < 3) {
        lVar18 = 1;
      }
      sVar19 = sVar19 + lVar18;
      lVar14 = lVar14 + 0x10;
    }
    hash_table = new_hash_table(0x18,8);
    sVar10 = model->index_count;
    lVar14 = 0;
    bVar24 = false;
    bVar22 = 0;
    while (bVar25 = sVar10 != 0, sVar10 = sVar10 - 1, bVar25) {
      poVar1 = model->indices;
      key = (obj_index *)((long)&poVar1->v + lVar14);
      bVar24 = (bool)(bVar24 | *(long *)((long)&poVar1->n + lVar14) != 0);
      bVar22 = bVar22 | *(long *)((long)&poVar1->t + lVar14) != 0;
      local_38 = hash_table->size;
      hash = hash_obj_index(key);
      insert_in_hash_table(hash_table,key,0x18,&local_38,8,hash,compare_obj_index);
      lVar14 = lVar14 + 0x18;
    }
    pvVar21 = (void *)0x0;
    mesh = new_mesh(TRI_MESH,sVar19,hash_table->size,obj_attr_types,obj_attr_bindings,
                    (ulong)bVar22 | 4);
    paVar2 = mesh->attrs;
    if (bVar22 != 0) {
      pvVar21 = paVar2[mesh->attr_count - 1].data;
    }
    pvVar3 = paVar2->data;
    pvVar4 = paVar2[1].data;
    sVar10 = hash_table->cap;
    lVar14 = 4;
    for (sVar19 = 0; sVar10 != sVar19; sVar19 = sVar19 + 1) {
      if ((int)hash_table->hashes[sVar19] < 0) {
        pvVar5 = hash_table->keys;
        lVar18 = *(long *)((long)hash_table->values + sVar19 * 8);
        lVar20 = lVar18 * 0xc;
        pvVar6 = model->vertices;
        lVar7 = *(long *)((long)pvVar5 + lVar14 * 4 + -0x10);
        *(real_t *)((long)pvVar3 + lVar20 + 8) = pvVar6[lVar7]._[2];
        *(undefined8 *)((long)pvVar3 + lVar20) = *(undefined8 *)pvVar6[lVar7]._;
        if (bVar24) {
          pvVar6 = model->normals;
          lVar7 = *(long *)((long)pvVar5 + lVar14 * 4 + -8);
          *(real_t *)((long)pvVar4 + lVar20 + 8) = pvVar6[lVar7]._[2];
          *(undefined8 *)((long)pvVar4 + lVar20) = *(undefined8 *)pvVar6[lVar7]._;
        }
        if (bVar22 != 0) {
          *(undefined8 *)((long)pvVar21 + lVar18 * 8) =
               *(undefined8 *)model->tex_coords[*(long *)((long)pvVar5 + lVar14 * 4)]._;
        }
      }
      lVar14 = lVar14 + 6;
    }
    sVar10 = model->face_count;
    uVar16 = 0;
    for (sVar19 = 0; sVar19 != sVar10; sVar19 = sVar19 + 1) {
      if (model->faces[sVar19].index_count < 3) {
        __assertion = "face->index_count >= 3";
        __line = 0x65;
LAB_00104539:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/madmann91[P]rt/src/io/import_obj.c"
                      ,__line,"struct mesh *build_mesh_from_obj_model(const struct obj_model *)");
      }
      poVar23 = model->faces + sVar19;
      sVar11 = translate_obj_index(hash_table,model->indices + poVar23->first_index);
      sVar12 = translate_obj_index(hash_table,model->indices + poVar23->first_index + 1);
      uVar8 = poVar23->index_count;
      lVar14 = 0x30;
      uVar17 = uVar16;
      for (uVar15 = 2; uVar15 < uVar8; uVar15 = uVar15 + 1) {
        if (mesh->primitive_count <= uVar17) {
          __assertion = "k < mesh->primitive_count";
          __line = 0x78;
          goto LAB_00104539;
        }
        sVar13 = translate_obj_index(hash_table,
                                     (obj_index *)
                                     ((long)&model->indices[poVar23->first_index].v + lVar14));
        psVar9 = mesh->indices;
        *(size_t *)((long)psVar9 + lVar14 + -0x30 + uVar16 * 0x18) = sVar11;
        *(size_t *)((long)psVar9 + lVar14 + -0x28 + uVar16 * 0x18) = sVar12;
        *(size_t *)((long)psVar9 + lVar14 + -0x20 + uVar16 * 0x18) = sVar13;
        uVar17 = uVar17 + 1;
        lVar14 = lVar14 + 0x18;
        sVar12 = sVar13;
      }
      uVar16 = uVar17;
    }
    free_hash_table(hash_table);
    recompute_geometry_normals(mesh);
    if (!bVar24) {
      recompute_shading_normals(mesh);
    }
    free_obj_model(model);
  }
  return mesh;
}

Assistant:

struct mesh* import_obj_model(struct scene* scene, const char* file_name) {
    // TODO: Convert materials
    IGNORE(scene);
    struct obj_model* model = load_obj_model(file_name);
    if (!model)
        return NULL;
    struct mesh* mesh = build_mesh_from_obj_model(model);
    free_obj_model(model);
    return mesh;
}